

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O1

error arc::lex(char *str,char **start,char **end)

{
  char cVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  char *__s;
  
  sVar2 = strspn(str," \t\r\n");
  if (str[sVar2] != '\0') {
    __s = str + sVar2;
    do {
      *start = __s;
      cVar1 = *__s;
      pvVar3 = memchr("()[]\'`",(int)cVar1,7);
      if (pvVar3 != (void *)0x0) {
        *end = __s + 1;
        return ERROR_OK;
      }
      if (cVar1 != ';') {
        if (cVar1 == ',') {
          pcVar4 = __s + (ulong)(__s[1] == '@') + 1;
        }
        else if (cVar1 == '\"') {
          do {
            while (pcVar4 = __s, cVar1 = pcVar4[1], cVar1 == '\\') {
              __s = pcVar4 + 2;
            }
            if (cVar1 == '\0') {
              return ERROR_FILE;
            }
            __s = pcVar4 + 1;
          } while (cVar1 != '\"');
          pcVar4 = pcVar4 + 2;
        }
        else {
          sVar2 = strcspn(__s,"()[] \t\r\n;");
          pcVar4 = __s + sVar2;
        }
        *end = pcVar4;
        return ERROR_OK;
      }
      sVar2 = strcspn(__s,"\n");
      pcVar4 = __s + sVar2;
      sVar2 = strspn(pcVar4," \t\r\n");
      __s = pcVar4 + sVar2;
    } while (pcVar4[sVar2] != '\0');
  }
  *end = (char *)0x0;
  *start = (char *)0x0;
  return ERROR_FILE;
}

Assistant:

error lex(const char* str, const char** start, const char** end)
	{
		const char* ws = " \t\r\n";
		const char* delim = "()[] \t\r\n;";
		const char* prefix = "()[]'`";
	start:
		str += strspn(str, ws);

		if (str[0] == '\0') {
			*start = *end = NULL;
			return ERROR_FILE;
		}

		*start = str;

		if (strchr(prefix, str[0]) != NULL)
			*end = str + 1;
		else if (str[0] == ',')
			*end = str + (str[1] == '@' ? 2 : 1);
		else if (str[0] == '"') {
			str++;
			while (1) {
				if (*str == 0) return ERROR_FILE; /* string not terminated */
				if (*str == '\\') str++;
				else if (*str == '"') {
					break;
				}
				str++;
			}
			*end = str + 1;
		}
		else if (str[0] == ';') { /* end-of-line comment */
			str += strcspn(str, "\n");
			goto start;
		}
		else
			*end = str + strcspn(str, delim);

		return ERROR_OK;
	}